

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

json_array * __thiscall
json_deserializer::deserialize_array(json_array *__return_storage_ptr__,json_deserializer *this)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  vector<json_element*,std::allocator<json_element*>> *pvVar4;
  json_object *local_120;
  undefined1 local_118 [8];
  json_object jsonObject;
  undefined1 local_d8 [8];
  json_bool jsonBool_1;
  undefined1 local_c0 [8];
  json_bool jsonBool;
  undefined1 local_a8 [8];
  json_array jsonArray;
  undefined1 local_80 [8];
  json_number jsonNumber;
  undefined1 local_68 [8];
  json_null jsonNull;
  json_str jsonStr;
  bool hasNext;
  json_deserializer *this_local;
  json_array *array;
  
  memset(__return_storage_ptr__,0,0x20);
  json_array::json_array(__return_storage_ptr__);
  bVar1 = true;
  while( true ) {
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    json_reader::next(&this->reader);
    cVar2 = json_reader::current(&this->reader);
    if (cVar2 == ']') break;
    uVar3 = current_deserialization_type(this);
    if ((uVar3 & 2) == 0) {
      uVar3 = current_deserialization_type(this);
      if ((uVar3 & 1) == 0) {
        uVar3 = current_deserialization_type(this);
        if ((uVar3 & 4) == 0) {
          uVar3 = current_deserialization_type(this);
          if ((uVar3 & 0x10) == 0) {
            uVar3 = current_deserialization_type(this);
            if ((uVar3 & 8) == 0) {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x20) != 0) {
                deserialize_json_object((json_object *)local_118,this);
                pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                         json_array::vlist(__return_storage_ptr__);
                local_120 = (json_object *)local_118;
                std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_object*>
                          (pvVar4,&local_120);
                json_object::~json_object((json_object *)local_118);
              }
            }
            else {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x40) == 0) {
                uVar3 = current_deserialization_type(this);
                if ((uVar3 & 0x80) != 0) {
                  deserialize_bool_false((json_deserializer *)local_d8);
                  pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                           json_array::vlist(__return_storage_ptr__);
                  jsonObject.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_d8
                  ;
                  std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_bool*>
                            (pvVar4,(json_bool **)
                                    &jsonObject.map._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
                }
              }
              else {
                deserialize_bool_true((json_deserializer *)local_c0);
                pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                         json_array::vlist(__return_storage_ptr__);
                jsonBool_1._8_8_ = local_c0;
                std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_bool*>
                          (pvVar4,(json_bool **)&jsonBool_1.value);
              }
            }
          }
          else {
            deserialize_array((json_array *)local_a8,this);
            pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                     json_array::vlist(__return_storage_ptr__);
            jsonBool._8_8_ = local_a8;
            std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_array*>
                      (pvVar4,(json_array **)&jsonBool.value);
            json_array::~json_array((json_array *)local_a8);
          }
        }
        else {
          deserialize_number((json_deserializer *)local_80);
          pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                   json_array::vlist(__return_storage_ptr__);
          jsonArray.values.super__Vector_base<json_element_*,_std::allocator<json_element_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_80;
          std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_number*>
                    (pvVar4,(json_number **)
                            &jsonArray.values.
                             super__Vector_base<json_element_*,_std::allocator<json_element_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        deserialize_null((json_deserializer *)local_68);
        pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
                 json_array::vlist(__return_storage_ptr__);
        jsonNumber.value = (double)local_68;
        std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_null*>
                  (pvVar4,(json_null **)&jsonNumber.value);
      }
    }
    else {
      deserialize_str((json_str *)&stack0xffffffffffffffa8,this);
      pvVar4 = (vector<json_element*,std::allocator<json_element*>> *)
               json_array::vlist(__return_storage_ptr__);
      jsonNull.super_json_element._vptr_json_element = (json_element)&stack0xffffffffffffffa8;
      std::vector<json_element*,std::allocator<json_element*>>::emplace_back<json_str*>
                (pvVar4,(json_str **)&jsonNull);
      json_str::~json_str((json_str *)&stack0xffffffffffffffa8);
    }
    cVar2 = json_reader::current(&this->reader);
    if (cVar2 == ']') {
      bVar1 = false;
    }
    json_reader::next(&this->reader);
    cVar2 = json_reader::current(&this->reader);
    if (cVar2 == ']') {
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

json_array deserialize_array() {
        json_array array = json_array();

        bool hasNext = true;
        while (hasNext) {
            reader.next();

            if (reader.current() == closing_array) {
                return array;
            }

            if ((current_deserialization_type() & g_json_str) != 0) {
                json_str jsonStr = deserialize_str();
                array.vlist() -> emplace_back(&jsonStr);
            } else if ((current_deserialization_type() & g_json_null) != 0) {
                json_null jsonNull = deserialize_null();
                array.vlist() -> emplace_back(&jsonNull);
            } else if ((current_deserialization_type() & g_json_number) != 0) {
                json_number jsonNumber = deserialize_number();
                array.vlist() -> emplace_back(&jsonNumber);
            } else if ((current_deserialization_type() & g_json_array) != 0) {
                json_array jsonArray = deserialize_array();
                array.vlist() -> emplace_back(&jsonArray);
            } else if ((current_deserialization_type() & g_json_bool) != 0) {
                if ((current_deserialization_type() & g_json_true) != 0) {
                    json_bool jsonBool = deserialize_bool_true();
                    array.vlist() -> emplace_back(&jsonBool);
                } else if ((current_deserialization_type() & g_json_false) != 0) {
                    json_bool jsonBool = deserialize_bool_false();
                    array.vlist() -> emplace_back(&jsonBool);
                }
            } else if ((current_deserialization_type() & g_json_object) != 0) {
                json_object jsonObject = deserialize_json_object();
                array.vlist() -> emplace_back(&jsonObject);
            } else {
                // eat it up
            }

            if (reader.current() == closing_array) {
                hasNext = false;
            }
            reader.next();
            if (reader.current() == closing_array) {
                hasNext = false;
            }
        }

        return array;
    }